

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> __thiscall
enact::Parser::parsePrecCast(Parser *this)

{
  pointer pcVar1;
  CompileContext *pCVar2;
  long *plVar3;
  CompileContext *pCVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  size_type *psVar6;
  pointer *__ptr;
  Parser *in_RSI;
  unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_> typename_;
  Token oper;
  undefined1 local_b0 [64];
  pointer local_70;
  _Alloc_hider local_68;
  undefined4 local_60;
  undefined4 uStack_5c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  parsePrecRange(this);
  if ((in_RSI->m_current).type == AS) {
    advance(in_RSI);
  }
  else {
    if ((in_RSI->m_current).type != IS) {
      return (__uniq_ptr_data<enact::Expr,_std::default_delete<enact::Expr>,_true,_true>)
             (__uniq_ptr_data<enact::Expr,_std::default_delete<enact::Expr>,_true,_true>)this;
    }
    advance(in_RSI);
  }
  local_b0._56_4_ = (in_RSI->m_previous).type;
  pcVar1 = (in_RSI->m_previous).lexeme._M_dataplus._M_p;
  local_70 = (pointer)&local_60;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar1,pcVar1 + (in_RSI->m_previous).lexeme._M_string_length);
  aStack_58._12_2_ = (in_RSI->m_previous).col;
  aStack_58._8_4_ = (in_RSI->m_previous).line;
  std::operator+(&local_48,"Expected typename after \'",&(in_RSI->m_previous).lexeme);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_48);
  psVar6 = (size_type *)(plVar3 + 2);
  if ((size_type *)*plVar3 == psVar6) {
    local_b0._24_8_ = *psVar6;
    local_b0._32_8_ = plVar3[3];
    local_b0._8_8_ = local_b0 + 0x18;
  }
  else {
    local_b0._24_8_ = *psVar6;
    local_b0._8_8_ = (size_type *)*plVar3;
  }
  local_b0._16_8_ = plVar3[1];
  *plVar3 = (long)psVar6;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  expectTypenamePrecFunction((Parser *)local_b0,(string *)in_RSI,(bool)((char)local_b0 + '\b'));
  if ((undefined1 *)local_b0._8_8_ != local_b0 + 0x18) {
    operator_delete((void *)local_b0._8_8_,local_b0._24_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  pCVar4 = (CompileContext *)operator_new(0x48);
  pCVar2 = this->m_context;
  this->m_context = (CompileContext *)0x0;
  if (local_70 == (pointer)&local_60) {
    local_b0._40_4_ = aStack_58._M_allocated_capacity._0_4_;
    local_b0._44_4_ = aStack_58._M_allocated_capacity._4_4_;
    local_b0._16_8_ = local_b0 + 0x20;
  }
  else {
    local_b0._16_8_ = local_70;
  }
  local_b0._36_4_ = uStack_5c;
  local_b0._32_4_ = local_60;
  (pCVar4->m_source)._M_dataplus._M_p = (pointer)&PTR__CastExpr_001295e8;
  (pCVar4->m_source)._M_string_length = (size_type)pCVar2;
  (pCVar4->m_source).field_2._M_allocated_capacity = local_b0._0_8_;
  *(undefined4 *)((long)&(pCVar4->m_source).field_2 + 8) = local_b0._56_4_;
  paVar5 = &(pCVar4->m_options).m_filename.field_2;
  (pCVar4->m_options).m_filename._M_dataplus._M_p = (pointer)paVar5;
  if ((undefined1 *)local_b0._16_8_ == local_b0 + 0x20) {
    *(undefined4 *)paVar5 = local_60;
    *(undefined4 *)((long)&(pCVar4->m_options).m_filename.field_2 + 4) = uStack_5c;
    *(undefined4 *)((long)&(pCVar4->m_options).m_filename.field_2 + 8) = local_b0._40_4_;
    *(undefined4 *)((long)&(pCVar4->m_options).m_filename.field_2 + 0xc) = local_b0._44_4_;
  }
  else {
    (pCVar4->m_options).m_filename._M_dataplus._M_p = (pointer)local_b0._16_8_;
    (pCVar4->m_options).m_filename.field_2._M_allocated_capacity = local_b0._32_8_;
  }
  (pCVar4->m_options).m_filename._M_string_length = (size_type)local_68._M_p;
  *(undefined2 *)
   ((long)&(pCVar4->m_options).m_programArgs.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start + 4) = aStack_58._12_2_;
  *(undefined4 *)
   &(pCVar4->m_options).m_programArgs.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = aStack_58._8_4_;
  this->m_context = pCVar4;
  return (__uniq_ptr_data<enact::Expr,_std::default_delete<enact::Expr>,_true,_true>)
         (__uniq_ptr_data<enact::Expr,_std::default_delete<enact::Expr>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Expr> Parser::parsePrecCast() {
        std::unique_ptr<Expr> expr = parsePrecRange();

        if (consume(TokenType::AS) || consume(TokenType::IS)) {
            Token oper = m_previous;
            std::unique_ptr<const Typename> typename_ = expectTypename(
                    "Expected typename after '" + m_previous.lexeme + "'.");
            expr = std::make_unique<CastExpr>(std::move(expr), std::move(typename_), std::move(oper));
        }

        return expr;
    }